

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O3

_Bool coll_tmap_contains_value(coll_tmap_t *map,void *value)

{
  void *pvVar1;
  coll_tmap_entry_t *pcVar2;
  _Bool _Var3;
  coll_tmap_entry_t *pcVar4;
  coll_tmap_entry_t *pcVar5;
  bool bVar6;
  
  pcVar5 = map->root;
  if (map->root == (coll_tmap_entry_t *)0x0) {
    _Var3 = false;
  }
  else {
    do {
      pcVar4 = pcVar5;
      pcVar5 = pcVar4->left;
    } while (pcVar4->left != (coll_tmap_entry_t *)0x0);
    _Var3 = true;
    pvVar1 = pcVar4->val;
    while (pvVar1 != value) {
      pcVar5 = pcVar4;
      pcVar2 = pcVar4->right;
      if (pcVar4->right == (coll_tmap_entry_t *)0x0) {
        do {
          pcVar4 = pcVar5->parent;
          if (pcVar4 == (coll_tmap_entry_t *)0x0) {
            return pvVar1 == value;
          }
          bVar6 = pcVar4->right == pcVar5;
          pcVar5 = pcVar4;
        } while (bVar6);
      }
      else {
        do {
          pcVar4 = pcVar2;
          pcVar2 = pcVar4->left;
        } while (pcVar4->left != (coll_tmap_entry_t *)0x0);
      }
      pvVar1 = pcVar4->val;
    }
  }
  return _Var3;
}

Assistant:

bool coll_tmap_contains_value(coll_tmap_t *map, void *value) {
    entry_t *cur = entry_first(map->root);
    while (cur) {
        if (cur->val == value) {
            return true;
        }
        cur = entry_next(cur);
    }
    return false;
}